

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

int QString::localeAwareCompare_helper
              (QChar *data1,qsizetype length1,QChar *data2,qsizetype length2)

{
  int iVar1;
  qsizetype qVar2;
  long lVar3;
  QStringView s2;
  QStringView s1;
  
  if (length1 != 0 && length2 != 0) {
    s2.m_data = &data2->ucs;
    s2.m_size = length2;
    s1.m_data = &data1->ucs;
    s1.m_size = length1;
    iVar1 = QCollator::defaultCompare(s1,s2);
    return iVar1;
  }
  qVar2 = length2;
  if ((ulong)length1 < (ulong)length2) {
    qVar2 = length1;
  }
  if (qVar2 != 0) {
    lVar3 = 0;
    do {
      iVar1 = (uint)(ushort)data1[lVar3].ucs - (uint)(ushort)data2[lVar3].ucs;
      if (iVar1 != 0) {
        return iVar1;
      }
      lVar3 = lVar3 + 1;
    } while (qVar2 != lVar3);
  }
  iVar1 = ((length2 < length1) - 1) + (uint)(length2 < length1);
  if (length1 == length2) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int QString::localeAwareCompare_helper(const QChar *data1, qsizetype length1,
                                       const QChar *data2, qsizetype length2)
{
    Q_ASSERT(length1 >= 0);
    Q_ASSERT(data1 || length1 == 0);
    Q_ASSERT(length2 >= 0);
    Q_ASSERT(data2 || length2 == 0);

    // do the right thing for null and empty
    if (length1 == 0 || length2 == 0)
        return QtPrivate::compareStrings(QStringView(data1, length1), QStringView(data2, length2),
                               Qt::CaseSensitive);

#if QT_CONFIG(icu)
    return QCollator::defaultCompare(QStringView(data1, length1), QStringView(data2, length2));
#else
    const QString lhs = QString::fromRawData(data1, length1).normalized(QString::NormalizationForm_C);
    const QString rhs = QString::fromRawData(data2, length2).normalized(QString::NormalizationForm_C);
#  if defined(Q_OS_WIN)
    int res = CompareStringEx(LOCALE_NAME_USER_DEFAULT, 0, (LPWSTR)lhs.constData(), lhs.length(), (LPWSTR)rhs.constData(), rhs.length(), NULL, NULL, 0);

    switch (res) {
    case CSTR_LESS_THAN:
        return -1;
    case CSTR_GREATER_THAN:
        return 1;
    default:
        return 0;
    }
#  elif defined (Q_OS_DARWIN)
    // Use CFStringCompare for comparing strings on Mac. This makes Qt order
    // strings the same way as native applications do, and also respects
    // the "Order for sorted lists" setting in the International preferences
    // panel.
    const CFStringRef thisString =
        CFStringCreateWithCharactersNoCopy(kCFAllocatorDefault,
            reinterpret_cast<const UniChar *>(lhs.constData()), lhs.length(), kCFAllocatorNull);
    const CFStringRef otherString =
        CFStringCreateWithCharactersNoCopy(kCFAllocatorDefault,
            reinterpret_cast<const UniChar *>(rhs.constData()), rhs.length(), kCFAllocatorNull);

    const int result = CFStringCompare(thisString, otherString, kCFCompareLocalized);
    CFRelease(thisString);
    CFRelease(otherString);
    return result;
#  elif defined(Q_OS_UNIX)
    // declared in <string.h> (no better than QtPrivate::compareStrings() on Android, sadly)
    return strcoll(lhs.toLocal8Bit().constData(), rhs.toLocal8Bit().constData());
#  else
#     error "This case shouldn't happen"
    return QtPrivate::compareStrings(lhs, rhs, Qt::CaseSensitive);
#  endif
#endif // !QT_CONFIG(icu)
}